

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O1

QMetaMethodBuilder __thiscall
QMetaObjectBuilder::addSlot(QMetaObjectBuilder *this,QByteArray *signature)

{
  QMetaObjectBuilderPrivate *pQVar1;
  pointer pQVar2;
  pointer pQVar3;
  long in_FS_OFFSET;
  QMetaMethodBuilder QVar4;
  QByteArray local_b8;
  QMetaMethodBuilderPrivate local_a0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->d;
  pQVar2 = (pQVar1->methods).
           super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pQVar3 = (pQVar1->methods).
           super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  QByteArray::QByteArray(&local_b8,"void",-1);
  QMetaMethodBuilderPrivate::QMetaMethodBuilderPrivate(&local_a0,Slot,signature,&local_b8,Public,0);
  std::vector<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>::
  emplace_back<QMetaMethodBuilderPrivate>(&pQVar1->methods,&local_a0);
  if (&(local_a0.tag.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a0.tag.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a0.tag.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a0.tag.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a0.tag.d.d)->super_QArrayData,1,0x10);
    }
  }
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_a0.parameterNames.d);
  if (&(local_a0.returnType.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a0.returnType.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a0.returnType.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a0.returnType.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_a0.returnType.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_a0.signature.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a0.signature.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a0.signature.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_a0.signature.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_a0.signature.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar4._index = (int)((ulong)((long)pQVar3 - (long)pQVar2) >> 3) * -0x3b13b13b;
    QVar4._mobj = this;
    QVar4._12_4_ = 0;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QMetaMethodBuilder QMetaObjectBuilder::addSlot(const QByteArray &signature)
{
    int index = int(d->methods.size());
    d->methods.push_back(QMetaMethodBuilderPrivate(QMetaMethod::Slot, signature));
    return QMetaMethodBuilder(this, index);
}